

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O3

void __thiscall re2::Tester::Tester(Tester *this,StringPiece *regexp)

{
  pointer *pppTVar1;
  iterator __position;
  TestInstance *this_00;
  long lVar2;
  long lVar3;
  TestInstance *t;
  TestInstance *local_38;
  
  (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->error_ = false;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      this_00 = (TestInstance *)operator_new(0x48);
      TestInstance::TestInstance
                (this_00,regexp,(&kinds)[lVar2],*(ParseFlags *)((long)&parse_modes + lVar3));
      this->error_ = (bool)(this->error_ | this_00->error_);
      __position._M_current =
           (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_38 = this_00;
      if (__position._M_current ==
          (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<re2::TestInstance*,std::allocator<re2::TestInstance*>>::
        _M_realloc_insert<re2::TestInstance*const&>
                  ((vector<re2::TestInstance*,std::allocator<re2::TestInstance*>> *)&this->v_,
                   __position,&local_38);
      }
      else {
        *__position._M_current = this_00;
        pppTVar1 = &(this->v_).
                    super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 200);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

Tester::Tester(const StringPiece& regexp) {
  error_ = false;
  for (int i = 0; i < arraysize(kinds); i++) {
    for (int j = 0; j < arraysize(parse_modes); j++) {
      TestInstance* t = new TestInstance(regexp, kinds[i],
                                         parse_modes[j].parse_flags);
      error_ |= t->error();
      v_.push_back(t);
    }
  }
}